

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void AccessibilityCheckNode(TidyDocImpl *doc,Node *node)

{
  Node **ppNVar1;
  tmbchar *ptVar2;
  Lexer *pLVar3;
  Dict *pDVar4;
  bool bVar5;
  Bool BVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  TidyTagId TVar10;
  int iVar11;
  Node *pNVar12;
  AttVal *pAVar13;
  uint maxExt;
  uint maxExt_00;
  ulong uVar14;
  Node *pNVar15;
  uint uVar16;
  ctmbstr cp_3;
  tmbchar *ptVar17;
  ctmbstr cp_1;
  long lVar18;
  ctmbstr cp;
  char *pcVar19;
  bool bVar20;
  tmbstr txt;
  tmbchar local_68 [32];
  tmbchar local_48 [24];
  
  if (node == (Node *)0x0) {
    BVar6 = prvTidynodeIsHeader((Node *)0x0);
    if (BVar6 == no) goto switchD_00139d99_caseD_3f;
    goto LAB_00139cec;
  }
  if (node->tag == (Dict *)0x0) goto switchD_00139bbd_caseD_33;
  TVar10 = node->tag->id;
  if ((int)TVar10 < 0x32) {
    if (0xf < (int)TVar10) {
      if ((int)TVar10 < 0x27) {
        if (TVar10 == TidyTag_BODY) {
          CheckColorContrast(doc,node);
          goto switchD_00139d99_caseD_3f;
        }
        if (TVar10 == TidyTag_FRAME) {
          CheckFrame(doc,node);
          goto switchD_00139d99_caseD_3f;
        }
        goto switchD_00139bbd_caseD_33;
      }
      if (TVar10 == TidyTag_FRAMESET) {
        CheckFrameSet(doc,node);
        goto switchD_00139d99_caseD_3f;
      }
      if (TVar10 != TidyTag_HEAD) goto switchD_00139bbd_caseD_33;
      BVar6 = CheckMetaData(doc,node,no);
      if ((BVar6 != no) || (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2))
      goto switchD_00139d99_caseD_3f;
      uVar8 = 0x1a6;
      goto LAB_00139ca3;
    }
    if (TVar10 != TidyTag_A) {
      if (TVar10 == TidyTag_APPLET) {
        CheckDeprecated(doc,node);
        ProgrammaticObjects(doc,node);
        DynamicContent(doc,node);
        AccessibleCompatible(doc,node);
        CheckFlicker(doc,node);
        CheckColorAvailable(doc,node);
        CheckApplet(doc,node);
        goto switchD_00139d99_caseD_3f;
      }
      if (TVar10 == TidyTag_AREA) {
        CheckArea(doc,node);
        goto switchD_00139d99_caseD_3f;
      }
      goto switchD_00139bbd_caseD_33;
    }
    pAVar13 = node->attributes;
    if (pAVar13 != (AttVal *)0x0) {
      ptVar2 = (doc->access).text;
      bVar20 = false;
LAB_00139f39:
      bVar5 = bVar20;
      if ((((0xfffffffc < (doc->access).PRIORITYCHK - 4U) && (pAVar13->dict != (Attribute *)0x0)) &&
          (pAVar13->dict->id == TidyAttr_HREF)) &&
         (pcVar19 = pAVar13->value, pcVar19 != (char *)0x0)) {
        do {
          if (*pcVar19 == '\0') goto LAB_0013a014;
          BVar6 = prvTidyIsWhite((int)*pcVar19);
          pcVar19 = pcVar19 + 1;
        } while (BVar6 != no);
        GetFileExtension(pAVar13->value,local_48,maxExt);
        BVar6 = IsValidMediaExtension(pAVar13->value);
        if (BVar6 != no) {
          prvTidyReportAccessError(doc,node,0x140);
        }
        uVar8 = prvTidytmbstrlen(local_48);
        if ((uVar8 < 6) && (uVar8 = prvTidytmbstrlen(local_48), uVar8 != 0)) {
          GetFileExtension(pAVar13->value,local_68,maxExt_00);
          lVar18 = 0;
          do {
            iVar7 = prvTidytmbstrcasecmp
                              (local_68,(ctmbstr)((long)&soundExtensions_rel +
                                                 (long)*(int *)((long)&soundExtensions_rel + lVar18)
                                                 ));
            if (iVar7 == 0) {
              uVar8 = *(uint *)((long)soundExtErrCodes + lVar18);
              pNVar12 = node->next;
              if ((pNVar12 == (Node *)0x0) || (pNVar12->tag != (Dict *)0x0)) goto LAB_0013a0b1;
              uVar16 = pNVar12->start;
              if (pNVar12->end <= uVar16) {
                uVar14 = 0;
                goto LAB_0013a11e;
              }
              pLVar3 = doc->lexer;
              uVar14 = 0;
              goto LAB_0013a0e5;
            }
            lVar18 = lVar18 + 4;
          } while (lVar18 != 0x18);
        }
      }
      goto LAB_0013a014;
    }
LAB_0013a14c:
    if (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2) goto switchD_00139d99_caseD_3f;
    pNVar12 = node->content;
    if (pNVar12 != (Node *)0x0) {
      if (pNVar12->tag == (Dict *)0x0) {
        ptVar2 = (doc->access).text;
        uVar16 = pNVar12->start;
        if (uVar16 < pNVar12->end) {
          pLVar3 = doc->lexer;
          uVar14 = 0;
          do {
            ptVar2[uVar14] = pLVar3->lexbuf[uVar14 + uVar16];
            if (uVar14 == 0x7f) {
              uVar14 = 0x7f;
              break;
            }
            lVar18 = uVar16 + uVar14;
            uVar14 = uVar14 + 1;
          } while (lVar18 + 1U < (ulong)pNVar12->end);
          uVar14 = uVar14 & 0xffffffff;
        }
        else {
          uVar14 = 0;
        }
        ptVar2[uVar14] = '\0';
        ptVar17 = ptVar2;
        do {
          if (*ptVar17 == '\0') goto LAB_0013a172;
          BVar6 = prvTidyIsWhite((int)*ptVar17);
          ptVar17 = ptVar17 + 1;
        } while (BVar6 != no);
        iVar7 = prvTidytmbstrcmp(ptVar2,"more");
        iVar11 = prvTidytmbstrcmp(ptVar2,"click here");
        if (iVar11 == 0) {
          prvTidyReportAccessWarning(doc,node,0x1a3);
        }
        if ((iVar7 != 0) && (uVar8 = prvTidytmbstrlen(ptVar2), uVar8 < 6)) {
          prvTidyReportAccessWarning(doc,node,0x1a0);
        }
        uVar8 = prvTidytmbstrlen(ptVar2);
        if (0x3c < uVar8) {
          prvTidyReportAccessWarning(doc,node,0x1a2);
        }
      }
LAB_0013a172:
      if (node->content != (Node *)0x0) goto switchD_00139d99_caseD_3f;
    }
    uVar8 = 0x1a1;
    goto LAB_0013a2e9;
  }
  if (0x4b < (int)TVar10) {
    if ((int)TVar10 < 0x5e) {
      if (TVar10 == TidyTag_OBJECT) {
        ProgrammaticObjects(doc,node);
        DynamicContent(doc,node);
        AccessibleCompatible(doc,node);
        CheckFlicker(doc,node);
        CheckColorAvailable(doc,node);
        CheckObject(doc,node);
        goto switchD_00139d99_caseD_3f;
      }
      if (TVar10 == TidyTag_PRE) {
LAB_00139cbb:
        CheckASCII(doc,node);
        goto switchD_00139d99_caseD_3f;
      }
    }
    else {
      if (TVar10 == TidyTag_SCRIPT) {
        DynamicContent(doc,node);
        ProgrammaticObjects(doc,node);
        AccessibleCompatible(doc,node);
        CheckFlicker(doc,node);
        CheckColorAvailable(doc,node);
        CheckScriptAcc(doc,node);
        goto switchD_00139d99_caseD_3f;
      }
      if (TVar10 == TidyTag_TABLE) {
        CheckColorContrast(doc,node);
        CheckTable(doc,node);
        goto switchD_00139d99_caseD_3f;
      }
      if (TVar10 == TidyTag_XMP) goto LAB_00139cbb;
    }
    goto switchD_00139bbd_caseD_33;
  }
  switch(TVar10) {
  case TidyTag_IFRAME:
    CheckIFrame(doc,node);
    break;
  case TidyTag_ILAYER:
  case TidyTag_INS:
  case TidyTag_ISINDEX:
  case TidyTag_KBD:
  case TidyTag_KEYGEN:
    goto switchD_00139bbd_caseD_33;
  case TidyTag_IMG:
    CheckFlicker(doc,node);
    CheckColorAvailable(doc,node);
    CheckImage(doc,node);
    break;
  case TidyTag_INPUT:
    CheckColorAvailable(doc,node);
    CheckInputLabel(doc,node);
    CheckInputAttributes(doc,node);
    break;
  case TidyTag_LABEL:
    CheckLabel(doc,node);
    break;
  default:
    if (TVar10 == TidyTag_MAP) {
      CheckMapLinks(doc,node);
      break;
    }
switchD_00139bbd_caseD_33:
    BVar6 = prvTidynodeIsHeader(node);
    if (BVar6 == no) {
      if (node->tag == (Dict *)0x0) break;
      TVar10 = node->tag->id;
      if ((int)TVar10 < 0x3d) {
        if ((int)TVar10 < 0x22) {
          if ((int)TVar10 < 0x14) {
            if (TVar10 != TidyTag_BASEFONT) {
              if (TVar10 == TidyTag_BLINK) {
                CheckBlink(doc,node);
              }
              break;
            }
          }
          else if ((TVar10 != TidyTag_CENTER) && (TVar10 != TidyTag_DIR)) break;
        }
        else if ((int)TVar10 < 0x30) {
          if (TVar10 == TidyTag_EMBED) {
            CheckEmbed(doc,node);
            ProgrammaticObjects(doc,node);
            AccessibleCompatible(doc,node);
            CheckFlicker(doc,node);
            break;
          }
          if (TVar10 != TidyTag_FONT) break;
        }
        else {
          if (TVar10 == TidyTag_HTML) {
            if ((doc->access).PRIORITYCHK == 3) {
              pAVar13 = prvTidyAttrGetById(node,TidyAttr_LANG);
              if (pAVar13 == (AttVal *)0x0) {
                uVar8 = 0x156;
              }
              else {
                pcVar19 = pAVar13->value;
                if (pcVar19 != (char *)0x0) {
                  do {
                    if (*pcVar19 == '\0') goto LAB_0013a5b0;
                    BVar6 = prvTidyIsWhite((int)*pcVar19);
                    pcVar19 = pcVar19 + 1;
                  } while (BVar6 != no);
                  break;
                }
LAB_0013a5b0:
                uVar8 = 0x157;
              }
LAB_00139ca3:
              prvTidyReportAccessError(doc,node,uVar8);
            }
            break;
          }
          if (TVar10 != TidyTag_ISINDEX) break;
        }
      }
      else {
        if ((int)TVar10 < 0x5c) {
          switch(TVar10) {
          case TidyTag_LI:
switchD_00139d99_caseD_3d:
            CheckListUsage(doc,node);
            break;
          case TidyTag_LINK:
            CheckLink(doc,node);
            break;
          case TidyTag_LISTING:
          case TidyTag_MAP:
          case TidyTag_MATHML:
            break;
          case TidyTag_MARQUEE:
            CheckMarquee(doc,node);
            break;
          case TidyTag_MENU:
            goto switchD_00139d99_caseD_43;
          default:
            if (TVar10 == TidyTag_OL) goto switchD_00139d99_caseD_3d;
            if ((((TVar10 != TidyTag_P) || (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2)) ||
                (pNVar12 = node->content, pNVar12 == (Node *)0x0)) ||
               (pNVar15 = pNVar12, pNVar12->tag == (Dict *)0x0)) break;
            do {
              if (pNVar15->tag == (Dict *)0x0) goto switchD_00139d99_caseD_3f;
              ppNVar1 = &pNVar15->next;
              pNVar15 = *ppNVar1;
            } while (*ppNVar1 != (Node *)0x0);
            if (pNVar12->tag->id == TidyTag_STRONG) {
              prvTidyReportAccessWarning(doc,node,0x14e);
              pNVar12 = node->content;
            }
            if ((pNVar12 == (Node *)0x0) || (pNVar12->tag == (Dict *)0x0)) break;
            TVar10 = pNVar12->tag->id;
            if (TVar10 == TidyTag_U) {
              prvTidyReportAccessWarning(doc,node,0x150);
              if ((node->content == (Node *)0x0) ||
                 (pDVar4 = node->content->tag, pDVar4 == (Dict *)0x0)) break;
              TVar10 = pDVar4->id;
            }
            if (TVar10 != TidyTag_EM) break;
            uVar8 = 0x14f;
            goto LAB_0013a2e9;
          }
          break;
        }
        if ((int)TVar10 < 0x70) {
          if ((TVar10 != TidyTag_S) && (TVar10 != TidyTag_STRIKE)) {
            if ((TVar10 != TidyTag_STYLE) ||
               (CheckColorContrast(doc,node), (doc->access).PRIORITYCHK - 4U < 0xfffffffd)) break;
            uVar8 = 0x168;
            goto LAB_0013a2e9;
          }
        }
        else {
          if (TVar10 == TidyTag_TH) {
            CheckTH(doc,node);
            break;
          }
          if (TVar10 != TidyTag_U) {
            if (TVar10 != TidyTag_UL) break;
            goto switchD_00139d99_caseD_3d;
          }
        }
      }
switchD_00139d99_caseD_43:
      CheckDeprecated(doc,node);
    }
    else {
LAB_00139cec:
      if (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2) break;
      pNVar12 = node->content;
      bVar20 = true;
      if ((pNVar12 != (Node *)0x0) && (pNVar12->tag == (Dict *)0x0)) {
        ptVar2 = (doc->access).text;
        uVar16 = pNVar12->start;
        if (uVar16 < pNVar12->end) {
          pLVar3 = doc->lexer;
          uVar14 = 0;
          do {
            ptVar2[uVar14] = pLVar3->lexbuf[uVar14 + uVar16];
            if (uVar14 == 0x7f) {
              uVar14 = 0x7f;
              break;
            }
            lVar18 = uVar16 + uVar14;
            uVar14 = uVar14 + 1;
          } while (lVar18 + 1U < (ulong)pNVar12->end);
          uVar14 = uVar14 & 0xffffffff;
        }
        else {
          uVar14 = 0;
        }
        ptVar2[uVar14] = '\0';
        uVar8 = prvTidytmbstrlen(ptVar2);
        if (uVar8 != 0) {
          uVar16 = 1;
          uVar14 = 0;
          do {
            uVar16 = uVar16 + (ptVar2[uVar14] == ' ');
            uVar14 = uVar14 + 1;
            uVar8 = prvTidytmbstrlen(ptVar2);
          } while (uVar14 < uVar8);
          bVar20 = uVar16 < 0x15;
        }
      }
      BVar6 = prvTidynodeIsHeader(node);
      if (BVar6 == no) {
LAB_0013a2c9:
        prvTidyReportAccessWarning(doc,node,0x14d);
      }
      else {
        uVar8 = prvTidynodeHeaderLevel(node);
        pNVar12 = node;
        do {
          pNVar12 = pNVar12->next;
          if (pNVar12 == (Node *)0x0) goto LAB_0013a2d9;
          uVar9 = prvTidynodeHeaderLevel(pNVar12);
        } while (uVar9 < uVar8);
        if (uVar8 + 1 < uVar9) goto LAB_0013a2c9;
      }
LAB_0013a2d9:
      if (bVar20) break;
      uVar8 = 0x151;
LAB_0013a2e9:
      prvTidyReportAccessWarning(doc,node,uVar8);
    }
  }
switchD_00139d99_caseD_3f:
  for (pNVar12 = node->content; pNVar12 != (Node *)0x0; pNVar12 = pNVar12->next) {
    AccessibilityCheckNode(doc,pNVar12);
  }
  return;
  while (lVar18 = uVar16 + uVar14, uVar14 = uVar14 + 1, lVar18 + 1U < (ulong)pNVar12->end) {
LAB_0013a0e5:
    ptVar2[uVar14] = pLVar3->lexbuf[uVar14 + uVar16];
    if (uVar14 == 0x7f) {
      uVar14 = 0x7f;
      break;
    }
  }
  uVar14 = uVar14 & 0xffffffff;
LAB_0013a11e:
  ptVar2[uVar14] = '\0';
  ptVar17 = ptVar2;
  do {
    if (*ptVar17 == '\0') goto LAB_0013a0b1;
    BVar6 = prvTidyIsWhite((int)*ptVar17);
    ptVar17 = ptVar17 + 1;
    bVar5 = true;
  } while (BVar6 != no);
LAB_0013a014:
  bVar20 = bVar5;
  if ((((((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) && (pAVar13->dict != (Attribute *)0x0)) &&
      (pAVar13->dict->id == TidyAttr_TARGET)) && (pAVar13->value != (ctmbstr)0x0)) {
    iVar7 = prvTidytmbstrcasecmp(pAVar13->value,"_new");
    if (iVar7 == 0) {
      uVar8 = 0x189;
    }
    else {
      if ((pAVar13->value == (ctmbstr)0x0) ||
         (iVar7 = prvTidytmbstrcasecmp(pAVar13->value,"_blank"), iVar7 != 0)) goto LAB_0013a07f;
      uVar8 = 0x18a;
    }
    prvTidyReportAccessWarning(doc,node,uVar8);
  }
LAB_0013a07f:
  pAVar13 = pAVar13->next;
  if (pAVar13 == (AttVal *)0x0) goto LAB_0013a14c;
  goto LAB_00139f39;
LAB_0013a0b1:
  bVar5 = true;
  if (!bVar20) {
    prvTidyReportAccessError(doc,node,uVar8);
    bVar5 = false;
  }
  goto LAB_0013a014;
}

Assistant:

static void AccessibilityCheckNode( TidyDocImpl* doc, Node* node )
{
    Node* content;
    
    /* Check BODY for color contrast */
    if ( nodeIsBODY(node) )
    {
        CheckColorContrast( doc, node );
    }

    /* Checks document for MetaData */
    else if ( nodeIsHEAD(node) )
    {
        if ( !CheckMetaData( doc, node, no ) )
          MetaDataPresent( doc, node );
    }
    
    /* Check the ANCHOR tag */
    else if ( nodeIsA(node) )
    {
        CheckAnchorAccess( doc, node );
    }

    /* Check the IMAGE tag */
    else if ( nodeIsIMG(node) )
    {
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckImage( doc, node );
    }

        /* Checks MAP for client-side text links */
    else if ( nodeIsMAP(node) )
    {
        CheckMapLinks( doc, node );
    }

    /* Check the AREA tag */
    else if ( nodeIsAREA(node) )
    {
        CheckArea( doc, node );
    }

    /* Check the APPLET tag */
    else if ( nodeIsAPPLET(node) )
    {
        CheckDeprecated( doc, node );
        ProgrammaticObjects( doc, node );
        DynamicContent( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckApplet(doc, node );
    }
    
    /* Check the OBJECT tag */
    else if ( nodeIsOBJECT(node) )
    {
        ProgrammaticObjects( doc, node );
        DynamicContent( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckObject( doc, node );
    }
    
    /* Check the FRAME tag */
    else if ( nodeIsFRAME(node) )
    {
        CheckFrame( doc, node );
    }
    
    /* Check the IFRAME tag */
    else if ( nodeIsIFRAME(node) )
    {
        CheckIFrame( doc, node );
    }
    
    /* Check the SCRIPT tag */
    else if ( nodeIsSCRIPT(node) )
    {
        DynamicContent( doc, node );
        ProgrammaticObjects( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckScriptAcc( doc, node );
    }

    /* Check the TABLE tag */
    else if ( nodeIsTABLE(node) )
    {
        CheckColorContrast( doc, node );
        CheckTable( doc, node );
    }

    /* Check the PRE for ASCII art */
    else if ( nodeIsPRE(node) || nodeIsXMP(node) )
    {
        CheckASCII( doc, node );
    }

    /* Check the LABEL tag */
    else if ( nodeIsLABEL(node) )
    {
        CheckLabel( doc, node );
    }

    /* Check INPUT tag for validity */
    else if ( nodeIsINPUT(node) )
    {
        CheckColorAvailable( doc, node );
        CheckInputLabel( doc, node );
        CheckInputAttributes( doc, node );
    }

    /* Checks FRAMESET element for NOFRAME section */
    else if ( nodeIsFRAMESET(node) )
    {
        CheckFrameSet( doc, node );
    }
    
    /* Checks for header elements for valid header increase */
    else if ( TY_(nodeIsHeader)(node) )
    {
        CheckHeaderNesting( doc, node );
    }

    /* Checks P element to ensure that it is not a header */
    else if ( nodeIsP(node) )
    {
        CheckParagraphHeader( doc, node );
    }

    /* Checks HTML elemnt for valid 'LANG' */
    else if ( nodeIsHTML(node) )
    {
        CheckHTMLAccess( doc, node );
    }

    /* Checks BLINK for any blinking text */
    else if ( nodeIsBLINK(node) )
    {
        CheckBlink( doc, node );
    }

    /* Checks MARQUEE for any MARQUEE text */
    else if ( nodeIsMARQUEE(node) )
    {
        CheckMarquee( doc, node );
    }

    /* Checks LINK for 'REL' attribute */
    else if ( nodeIsLINK(node) )
    {
        CheckLink( doc, node );
    }

    /* Checks to see if STYLE is used */
    else if ( nodeIsSTYLE(node) )
    {
        CheckColorContrast( doc, node );
        CheckStyle( doc, node );
    }

    /* Checks to see if EMBED is used */
    else if ( nodeIsEMBED(node) )
    {
        CheckEmbed( doc, node );
        ProgrammaticObjects( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
    }

    /* Deprecated HTML if the following tags are found in the document */
    else if ( nodeIsBASEFONT(node) ||
              nodeIsCENTER(node)   ||
              nodeIsISINDEX(node)  ||
              nodeIsU(node)        ||
              nodeIsFONT(node)     ||
              nodeIsDIR(node)      ||
              nodeIsS(node)        ||
              nodeIsSTRIKE(node)   ||
              nodeIsMENU(node) )
    {
        CheckDeprecated( doc, node );
    }

    /* Checks for 'ABBR' attribute if needed */
    else if ( nodeIsTH(node) )
    {
        CheckTH( doc, node );
    }

    /* Ensures that lists are properly used */
    else if ( nodeIsLI(node) || nodeIsOL(node) || nodeIsUL(node) )
    {
        CheckListUsage( doc, node );
    }

    /* Recursively check all child nodes.
    */
    for ( content = node->content; content != NULL; content = content->next )
    {
        AccessibilityCheckNode( doc, content );
    }
}